

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::session_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,session_error_alert *this)

{
  uint uVar1;
  error_category *peVar2;
  _Alloc_hider _Var3;
  char *pcVar4;
  size_t sVar5;
  char buf [400];
  string local_1f8;
  string local_1d8;
  char local_1b8 [408];
  
  if ((this->error).failed_ == true) {
    uVar1 = (this->error).val_;
    peVar2 = (this->error).cat_;
    (*peVar2->_vptr_error_category[4])(&local_1d8,peVar2,(ulong)uVar1);
    convert_from_native(&local_1f8,&local_1d8);
    _Var3._M_p = local_1f8._M_dataplus._M_p;
    pcVar4 = aux::stack_allocator::ptr
                       ((this->m_alloc)._M_data,(allocation_slot)(this->m_msg_idx).m_idx);
    snprintf(local_1b8,400,"session error: (%d %s) %s",(ulong)uVar1,_Var3._M_p,pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar4 = aux::stack_allocator::ptr
                       ((this->m_alloc)._M_data,(allocation_slot)(this->m_msg_idx).m_idx);
    snprintf(local_1b8,400,"session error: %s",pcVar4);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar5 = strlen(local_1b8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_1b8,local_1b8 + sVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string session_error_alert::message() const
	{
		char buf[400];
		if (error)
		{
			std::snprintf(buf, sizeof(buf), "session error: (%d %s) %s"
				, error.value(), convert_from_native(error.message()).c_str()
				, m_alloc.get().ptr(m_msg_idx));
		}
		else
		{
			std::snprintf(buf, sizeof(buf), "session error: %s"
				, m_alloc.get().ptr(m_msg_idx));
		}
		return buf;
	}